

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O1

Bbr_ImageNode_t *
Bbr_CombineTwoNodes(DdManager *dd,DdNode *bCube,Bbr_ImageNode_t *pNode1,Bbr_ImageNode_t *pNode2)

{
  int iVar1;
  Bbr_ImagePart_t *pBVar2;
  DdNode *pDVar3;
  Bbr_ImageNode_t *pBVar4;
  
  pBVar2 = (Bbr_ImagePart_t *)malloc(0x18);
  pBVar2->bFunc = (DdNode *)0x0;
  pBVar2->bSupp = (DdNode *)0x0;
  pBVar2->nNodes = 0;
  pBVar2->nSupp = 0;
  pBVar2->iPart = 0;
  pDVar3 = Cudd_bddAndAbstract(dd,pNode1->pPart->bFunc,pNode2->pPart->bFunc,bCube);
  pBVar2->bFunc = pDVar3;
  Cudd_Ref(pDVar3);
  pDVar3 = Cudd_bddAndAbstract(dd,pNode1->pPart->bSupp,pNode2->pPart->bSupp,bCube);
  pBVar2->bSupp = pDVar3;
  Cudd_Ref(pDVar3);
  iVar1 = Cudd_SupportSize(dd,pBVar2->bSupp);
  pBVar2->nSupp = (short)iVar1;
  iVar1 = Cudd_DagSize(pBVar2->bFunc);
  pBVar2->nNodes = iVar1;
  pBVar2->iPart = -1;
  pBVar4 = (Bbr_ImageNode_t *)malloc(0x30);
  pBVar4->dd = (DdManager *)0x0;
  pBVar4->bCube = (DdNode *)0x0;
  pBVar4->pNode2 = (Bbr_ImageNode_t *)0x0;
  pBVar4->pPart = (Bbr_ImagePart_t *)0x0;
  pBVar4->bImage = (DdNode *)0x0;
  pBVar4->pNode1 = (Bbr_ImageNode_t *)0x0;
  pBVar4->dd = dd;
  pBVar4->pPart = pBVar2;
  pBVar4->pNode1 = pNode1;
  pBVar4->pNode2 = pNode2;
  pDVar3 = Cudd_bddAndAbstract(dd,pNode1->bImage,pNode2->bImage,bCube);
  pBVar4->bImage = pDVar3;
  Cudd_Ref(pDVar3);
  if (dd->one != bCube) {
    pBVar4->bCube = bCube;
    Cudd_Ref(bCube);
  }
  return pBVar4;
}

Assistant:

Bbr_ImageNode_t * Bbr_CombineTwoNodes( DdManager * dd, DdNode * bCube,
    Bbr_ImageNode_t * pNode1, Bbr_ImageNode_t * pNode2 )
{
    Bbr_ImageNode_t * pNode;
    Bbr_ImagePart_t * pPart;

    // create a new partition
    pPart = ABC_ALLOC( Bbr_ImagePart_t, 1 );
    memset( pPart, 0, sizeof(Bbr_ImagePart_t) );
    // create the function
    pPart->bFunc = Cudd_bddAndAbstract( dd, pNode1->pPart->bFunc, pNode2->pPart->bFunc, bCube );
    Cudd_Ref( pPart->bFunc );
    // update the support the partition
    pPart->bSupp = Cudd_bddAndAbstract( dd, pNode1->pPart->bSupp, pNode2->pPart->bSupp, bCube );
    Cudd_Ref( pPart->bSupp );
    // update the numbers
    pPart->nSupp  = Cudd_SupportSize( dd, pPart->bSupp );
    pPart->nNodes = Cudd_DagSize( pPart->bFunc );
    pPart->iPart = -1;
/*
ABC_PRB( dd, pNode1->pPart->bSupp );
ABC_PRB( dd, pNode2->pPart->bSupp );
ABC_PRB( dd, pPart->bSupp );
*/
    // create a new node
    pNode = ABC_ALLOC( Bbr_ImageNode_t, 1 );
    memset( pNode, 0, sizeof(Bbr_ImageNode_t) );
    pNode->dd     = dd;
    pNode->pPart  = pPart;
    pNode->pNode1 = pNode1;
    pNode->pNode2 = pNode2;
    // compute the image
    pNode->bImage = Cudd_bddAndAbstract( dd, pNode1->bImage, pNode2->bImage, bCube ); 
    Cudd_Ref( pNode->bImage );
    // save the cube
    if ( bCube != b1 )
    {
        pNode->bCube = bCube;   Cudd_Ref( bCube );
    }
    return pNode;
}